

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O2

void ncnn::pack_B_tile_quantize(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int kk;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t *psVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  float fVar30;
  undefined4 in_XMM0_Db;
  float fVar31;
  undefined4 in_XMM0_Dc;
  float fVar32;
  undefined4 in_XMM0_Dd;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar68;
  undefined1 auVar73 [16];
  float fVar88;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [32];
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 in_ZMM10 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar99 [32];
  float fVar92;
  undefined1 auVar95 [16];
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar100 [32];
  float fVar104;
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 in_ZMM11 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  long local_118;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar101 [32];
  
  iVar9 = cpu_support_x86_avx_vnni_int8();
  if (iVar9 != 0) {
    pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar9 = cpu_support_x86_avx_vnni();
  if (iVar9 == 0) {
    iVar9 = cpu_support_x86_avx2();
    auVar37 = _DAT_00543100;
    auVar36 = _DAT_005430f0;
    if (iVar9 == 0) {
      psVar12 = (size_t *)&B->w;
      if (B->dims == 3) {
        psVar12 = &B->cstep;
      }
      iVar9 = B->elempack;
      iVar3 = (int)*psVar12;
      lVar19 = (long)iVar3;
      lVar24 = (long)(iVar9 * k);
      auVar61._4_4_ = in_XMM0_Db;
      auVar61._0_4_ = scale;
      auVar61._8_4_ = in_XMM0_Dc;
      auVar61._12_4_ = in_XMM0_Dd;
      auVar61 = vshufps_avx(auVar61,auVar61,0);
      lVar13 = (long)(iVar3 * 4);
      lVar14 = (long)(iVar3 * 2);
      lVar15 = (long)(iVar3 * 3);
      lVar16 = (long)(iVar3 * 3 + 1);
      lVar29 = (long)j;
      lVar20 = (long)k;
      lVar27 = lVar20 * 4 + lVar19 * lVar29 * 4;
      local_118 = lVar24 * 4 + lVar19 * lVar29 * 4;
      iVar10 = iVar3 * 7;
      lVar22 = (long)max_jj;
      lVar17 = lVar19 * 0x20;
      lVar25 = (lVar29 * 4 + 4) * lVar19 + lVar20 * 4;
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar49._8_4_ = 0x3f000000;
      auVar49._0_8_ = 0x3f0000003f000000;
      auVar49._12_4_ = 0x3f000000;
      auVar49._16_4_ = 0x3f000000;
      auVar49._20_4_ = 0x3f000000;
      auVar49._24_4_ = 0x3f000000;
      auVar49._28_4_ = 0x3f000000;
      auVar50._8_4_ = 0x7f007f;
      auVar50._0_8_ = 0x7f007f007f007f;
      auVar50._12_4_ = 0x7f007f;
      auVar64._8_4_ = 0xff81ff81;
      auVar64._0_8_ = 0xff81ff81ff81ff81;
      auVar64._12_4_ = 0xff81ff81;
      auVar34._8_4_ = 0x7f007f;
      auVar34._0_8_ = 0x7f007f007f007f;
      auVar34._12_4_ = 0x7f007f;
      auVar35._8_4_ = 0xff81ff81;
      auVar35._0_8_ = 0xff81ff81ff81ff81;
      auVar35._12_4_ = 0xff81ff81;
      lVar2 = lVar19 * 4;
      uVar23 = 0;
      pauVar28 = (undefined1 (*) [16])BT->data;
      while( true ) {
        pvVar4 = B->data;
        fVar30 = auVar61._0_4_;
        fVar31 = auVar61._4_4_;
        fVar32 = auVar61._8_4_;
        fVar33 = auVar61._12_4_;
        if (lVar22 <= (long)(uVar23 | 7)) break;
        pfVar18 = (float *)((long)pvVar4 + lVar24 * 4 + (lVar29 + uVar23) * lVar19 * 4);
        if (iVar9 == 8) {
          lVar21 = 0;
          for (iVar11 = 0; iVar11 + 1 < max_kk; iVar11 = iVar11 + 2) {
            pfVar1 = (float *)((long)pvVar4 + lVar21 * 4 + local_118);
            auVar83._0_4_ = fVar30 * *pfVar1;
            auVar83._4_4_ = fVar31 * pfVar1[1];
            auVar83._8_4_ = fVar32 * pfVar1[2];
            auVar83._12_4_ = fVar33 * pfVar1[3];
            auVar83._16_4_ = fVar30 * pfVar1[4];
            auVar83._20_4_ = fVar31 * pfVar1[5];
            auVar83._28_36_ = in_ZMM10._28_36_;
            auVar83._24_4_ = fVar32 * pfVar1[6];
            pfVar1 = (float *)((long)pvVar4 + lVar21 * 4 + local_118 + 0x20);
            auVar102._0_4_ = fVar30 * *pfVar1;
            auVar102._4_4_ = fVar31 * pfVar1[1];
            auVar102._8_4_ = fVar32 * pfVar1[2];
            auVar102._12_4_ = fVar33 * pfVar1[3];
            auVar102._16_4_ = fVar30 * pfVar1[4];
            auVar102._20_4_ = fVar31 * pfVar1[5];
            auVar102._28_36_ = in_ZMM11._28_36_;
            auVar102._24_4_ = fVar32 * pfVar1[6];
            auVar97 = vandps_avx(auVar83._0_32_,auVar38);
            auVar77 = vandps_avx(auVar102._0_32_,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar77 = vorps_avx(auVar77,auVar49);
            auVar69._0_4_ = (int)(auVar83._0_4_ + auVar97._0_4_);
            auVar69._4_4_ = (int)(auVar83._4_4_ + auVar97._4_4_);
            auVar69._8_4_ = (int)(auVar83._8_4_ + auVar97._8_4_);
            auVar69._12_4_ = (int)(auVar83._12_4_ + auVar97._12_4_);
            auVar76._16_4_ = (int)(auVar83._16_4_ + auVar97._16_4_);
            auVar76._0_16_ = auVar69;
            auVar76._20_4_ = (int)(auVar83._20_4_ + auVar97._20_4_);
            auVar76._24_4_ = (int)(auVar83._24_4_ + auVar97._24_4_);
            auVar76._28_4_ = (int)(in_ZMM10._28_4_ + auVar97._28_4_);
            auVar93._0_4_ = (int)(auVar102._0_4_ + auVar77._0_4_);
            auVar93._4_4_ = (int)(auVar102._4_4_ + auVar77._4_4_);
            auVar93._8_4_ = (int)(auVar102._8_4_ + auVar77._8_4_);
            auVar93._12_4_ = (int)(auVar102._12_4_ + auVar77._12_4_);
            auVar97._16_4_ = (int)(auVar102._16_4_ + auVar77._16_4_);
            auVar97._0_16_ = auVar93;
            auVar97._20_4_ = (int)(auVar102._20_4_ + auVar77._20_4_);
            auVar97._24_4_ = (int)(auVar102._24_4_ + auVar77._24_4_);
            auVar97._28_4_ = (int)(in_ZMM11._28_4_ + auVar77._28_4_);
            auVar40 = vpackssdw_avx(auVar69,auVar76._16_16_);
            auVar39 = vpackssdw_avx(auVar93,auVar97._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar50);
            auVar39 = vpminsw_avx(auVar39,auVar50);
            auVar40 = vpmaxsw_avx(auVar40,auVar64);
            auVar39 = vpmaxsw_avx(auVar39,auVar64);
            in_ZMM11 = ZEXT1664(auVar39);
            auVar40 = vpacksswb_avx(auVar40,auVar39);
            auVar40 = vpshufb_avx(auVar40,auVar36);
            in_ZMM10 = ZEXT1664(auVar40);
            *(undefined1 (*) [16])(*pauVar28 + lVar21) = auVar40;
            pfVar18 = pfVar18 + 0x10;
            lVar21 = lVar21 + 0x10;
          }
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar21);
          for (; iVar11 < max_kk; iVar11 = iVar11 + 1) {
            auVar84._0_4_ = fVar30 * *pfVar18;
            auVar84._4_4_ = fVar31 * pfVar18[1];
            auVar84._8_4_ = fVar32 * pfVar18[2];
            auVar84._12_4_ = fVar33 * pfVar18[3];
            auVar84._16_4_ = fVar30 * pfVar18[4];
            auVar84._20_4_ = fVar31 * pfVar18[5];
            auVar84._28_36_ = in_ZMM10._28_36_;
            auVar84._24_4_ = fVar32 * pfVar18[6];
            auVar97 = vandps_avx(auVar84._0_32_,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar70._0_4_ = (int)(auVar84._0_4_ + auVar97._0_4_);
            auVar70._4_4_ = (int)(auVar84._4_4_ + auVar97._4_4_);
            auVar70._8_4_ = (int)(auVar84._8_4_ + auVar97._8_4_);
            auVar70._12_4_ = (int)(auVar84._12_4_ + auVar97._12_4_);
            auVar77._16_4_ = (int)(auVar84._16_4_ + auVar97._16_4_);
            auVar77._0_16_ = auVar70;
            auVar77._20_4_ = (int)(auVar84._20_4_ + auVar97._20_4_);
            auVar77._24_4_ = (int)(auVar84._24_4_ + auVar97._24_4_);
            auVar77._28_4_ = (int)(in_ZMM10._28_4_ + auVar97._28_4_);
            in_ZMM11 = ZEXT1664(auVar77._16_16_);
            auVar40 = vpackssdw_avx(auVar70,auVar77._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar34);
            auVar40 = vpmaxsw_avx(auVar40,auVar35);
            auVar40 = vpacksswb_avx(auVar40,auVar40);
            in_ZMM10 = ZEXT1664(auVar40);
            *(long *)*pauVar28 = auVar40._0_8_;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            pfVar18 = pfVar18 + 8;
          }
        }
        if (iVar9 == 4) {
          for (iVar11 = 0; iVar11 + 1 < max_kk; iVar11 = iVar11 + 2) {
            auVar85._0_4_ = fVar30 * *pfVar18;
            auVar85._4_4_ = fVar31 * pfVar18[1];
            auVar85._8_4_ = fVar32 * pfVar18[2];
            auVar85._12_4_ = fVar33 * pfVar18[3];
            auVar85._16_4_ = fVar30 * pfVar18[4];
            auVar85._20_4_ = fVar31 * pfVar18[5];
            auVar85._28_36_ = in_ZMM10._28_36_;
            auVar85._24_4_ = fVar32 * pfVar18[6];
            pfVar1 = pfVar18 + lVar13;
            auVar103._0_4_ = fVar30 * *pfVar1;
            auVar103._4_4_ = fVar31 * pfVar1[1];
            auVar103._8_4_ = fVar32 * pfVar1[2];
            auVar103._12_4_ = fVar33 * pfVar1[3];
            auVar103._16_4_ = fVar30 * pfVar1[4];
            auVar103._20_4_ = fVar31 * pfVar1[5];
            auVar103._28_36_ = in_ZMM11._28_36_;
            auVar103._24_4_ = fVar32 * pfVar1[6];
            auVar97 = vandps_avx(auVar85._0_32_,auVar38);
            auVar77 = vandps_avx(auVar103._0_32_,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar77 = vorps_avx(auVar77,auVar49);
            auVar71._0_4_ = (int)(auVar85._0_4_ + auVar97._0_4_);
            auVar71._4_4_ = (int)(auVar85._4_4_ + auVar97._4_4_);
            auVar71._8_4_ = (int)(auVar85._8_4_ + auVar97._8_4_);
            auVar71._12_4_ = (int)(auVar85._12_4_ + auVar97._12_4_);
            auVar78._16_4_ = (int)(auVar85._16_4_ + auVar97._16_4_);
            auVar78._0_16_ = auVar71;
            auVar78._20_4_ = (int)(auVar85._20_4_ + auVar97._20_4_);
            auVar78._24_4_ = (int)(auVar85._24_4_ + auVar97._24_4_);
            auVar78._28_4_ = (int)(in_ZMM10._28_4_ + auVar97._28_4_);
            auVar94._0_4_ = (int)(auVar103._0_4_ + auVar77._0_4_);
            auVar94._4_4_ = (int)(auVar103._4_4_ + auVar77._4_4_);
            auVar94._8_4_ = (int)(auVar103._8_4_ + auVar77._8_4_);
            auVar94._12_4_ = (int)(auVar103._12_4_ + auVar77._12_4_);
            auVar98._16_4_ = (int)(auVar103._16_4_ + auVar77._16_4_);
            auVar98._0_16_ = auVar94;
            auVar98._20_4_ = (int)(auVar103._20_4_ + auVar77._20_4_);
            auVar98._24_4_ = (int)(auVar103._24_4_ + auVar77._24_4_);
            auVar98._28_4_ = (int)(in_ZMM11._28_4_ + auVar77._28_4_);
            auVar40 = vpackssdw_avx(auVar71,auVar78._16_16_);
            auVar39 = vpackssdw_avx(auVar94,auVar98._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar50);
            auVar39 = vpminsw_avx(auVar39,auVar50);
            auVar40 = vpmaxsw_avx(auVar40,auVar64);
            auVar39 = vpmaxsw_avx(auVar39,auVar64);
            in_ZMM11 = ZEXT1664(auVar39);
            auVar40 = vpacksswb_avx(auVar40,auVar39);
            auVar40 = vpshufb_avx(auVar40,auVar37);
            in_ZMM10 = ZEXT1664(auVar40);
            *pauVar28 = auVar40;
            pauVar28 = pauVar28 + 1;
            pfVar18 = pfVar18 + 8;
          }
          for (; iVar11 < max_kk; iVar11 = iVar11 + 1) {
            auVar5._4_4_ = pfVar18[1] * fVar31;
            auVar5._0_4_ = *pfVar18 * fVar30;
            auVar5._8_4_ = pfVar18[2] * fVar32;
            auVar5._12_4_ = pfVar18[3] * fVar33;
            auVar5._16_4_ = pfVar18[lVar13 + 4] * fVar30;
            auVar5._20_4_ = pfVar18[lVar13 + 5] * fVar31;
            auVar5._24_4_ = pfVar18[lVar13 + 6] * fVar32;
            auVar5._28_4_ = pfVar18[lVar13 + 7];
            auVar97 = vandps_avx(auVar5,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar72._0_4_ = (int)(*pfVar18 * fVar30 + auVar97._0_4_);
            auVar72._4_4_ = (int)(pfVar18[1] * fVar31 + auVar97._4_4_);
            auVar72._8_4_ = (int)(pfVar18[2] * fVar32 + auVar97._8_4_);
            auVar72._12_4_ = (int)(pfVar18[3] * fVar33 + auVar97._12_4_);
            auVar79._16_4_ = (int)(pfVar18[lVar13 + 4] * fVar30 + auVar97._16_4_);
            auVar79._0_16_ = auVar72;
            auVar79._20_4_ = (int)(pfVar18[lVar13 + 5] * fVar31 + auVar97._20_4_);
            auVar79._24_4_ = (int)(pfVar18[lVar13 + 6] * fVar32 + auVar97._24_4_);
            auVar79._28_4_ = (int)(pfVar18[lVar13 + 7] + auVar97._28_4_);
            in_ZMM11 = ZEXT1664(auVar79._16_16_);
            auVar40 = vpackssdw_avx(auVar72,auVar79._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar34);
            auVar40 = vpmaxsw_avx(auVar40,auVar35);
            auVar40 = vpacksswb_avx(auVar40,auVar40);
            in_ZMM10 = ZEXT1664(auVar40);
            *(long *)*pauVar28 = auVar40._0_8_;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            pfVar18 = pfVar18 + 4;
          }
        }
        pauVar26 = pauVar28;
        if (iVar9 == 1) {
          for (lVar21 = 0; (int)lVar21 + 1 < max_kk; lVar21 = lVar21 + 2) {
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)(pfVar18 + lVar21);
            auVar40 = vinsertps_avx(auVar73,ZEXT416((uint)pfVar18[lVar19 + lVar21]),0x20);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)pfVar18[(iVar3 + 1) + lVar21]),0x30);
            fVar68 = pfVar18[lVar15 + lVar21];
            auVar110._4_4_ = fVar68;
            auVar110._0_4_ = fVar68;
            auVar110._8_4_ = fVar68;
            auVar110._12_4_ = fVar68;
            auVar110._16_4_ = fVar68;
            auVar110._20_4_ = fVar68;
            auVar110._24_4_ = fVar68;
            auVar110._28_4_ = fVar68;
            auVar80._16_8_ = *(undefined8 *)(pfVar18 + lVar14 + lVar21);
            auVar80._0_16_ = auVar40;
            auVar80._24_8_ = 0;
            auVar97 = vblendps_avx(auVar80,auVar110,0x40);
            fVar68 = pfVar18[lVar16 + lVar21];
            auVar99._4_4_ = fVar68;
            auVar99._0_4_ = fVar68;
            auVar99._8_4_ = fVar68;
            auVar99._12_4_ = fVar68;
            auVar99._16_4_ = fVar68;
            auVar99._20_4_ = fVar68;
            auVar99._24_4_ = fVar68;
            auVar99._28_4_ = fVar68;
            auVar76 = vblendps_avx(auVar97,auVar99,0x80);
            auVar95._8_8_ = 0;
            auVar95._0_8_ = *(ulong *)(pfVar18 + lVar13 + lVar21);
            auVar40 = vinsertps_avx(auVar95,ZEXT416((uint)pfVar18[iVar3 * 5 + lVar21]),0x20);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)pfVar18[(iVar3 * 5 + 1) + lVar21]),0x30);
            auVar100._16_8_ = *(undefined8 *)(pfVar18 + iVar3 * 6 + lVar21);
            auVar100._0_16_ = auVar40;
            auVar100._24_8_ = 0;
            fVar68 = pfVar18[iVar10 + lVar21];
            auVar111._4_4_ = fVar68;
            auVar111._0_4_ = fVar68;
            auVar111._8_4_ = fVar68;
            auVar111._12_4_ = fVar68;
            auVar111._16_4_ = fVar68;
            auVar111._20_4_ = fVar68;
            auVar111._24_4_ = fVar68;
            auVar111._28_4_ = fVar68;
            fVar68 = pfVar18[(iVar10 + 1) + lVar21];
            auVar112._4_4_ = fVar68;
            auVar112._0_4_ = fVar68;
            auVar112._8_4_ = fVar68;
            auVar112._12_4_ = fVar68;
            auVar112._16_4_ = fVar68;
            auVar112._20_4_ = fVar68;
            auVar112._24_4_ = fVar68;
            auVar112._28_4_ = fVar68;
            auVar97 = vblendps_avx(auVar100,auVar111,0x40);
            auVar78 = vblendps_avx(auVar97,auVar112,0x80);
            fVar68 = auVar76._0_4_ * fVar30;
            fVar86 = auVar76._4_4_ * fVar31;
            auVar6._4_4_ = fVar86;
            auVar6._0_4_ = fVar68;
            fVar87 = auVar76._8_4_ * fVar32;
            auVar6._8_4_ = fVar87;
            fVar88 = auVar76._12_4_ * fVar33;
            auVar6._12_4_ = fVar88;
            fVar89 = auVar76._16_4_ * fVar30;
            auVar6._16_4_ = fVar89;
            fVar90 = auVar76._20_4_ * fVar31;
            auVar6._20_4_ = fVar90;
            fVar91 = auVar76._24_4_ * fVar32;
            auVar6._24_4_ = fVar91;
            auVar6._28_4_ = auVar76._28_4_;
            fVar92 = auVar78._0_4_ * fVar30;
            fVar104 = auVar78._4_4_ * fVar31;
            auVar7._4_4_ = fVar104;
            auVar7._0_4_ = fVar92;
            fVar105 = auVar78._8_4_ * fVar32;
            auVar7._8_4_ = fVar105;
            fVar106 = auVar78._12_4_ * fVar33;
            auVar7._12_4_ = fVar106;
            fVar107 = auVar78._16_4_ * fVar30;
            auVar7._16_4_ = fVar107;
            fVar108 = auVar78._20_4_ * fVar31;
            auVar7._20_4_ = fVar108;
            fVar109 = auVar78._24_4_ * fVar32;
            auVar7._24_4_ = fVar109;
            auVar7._28_4_ = auVar78._28_4_;
            auVar97 = vandps_avx(auVar6,auVar38);
            auVar77 = vandps_avx(auVar7,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar77 = vorps_avx(auVar77,auVar49);
            auVar74._0_4_ = (int)(fVar68 + auVar97._0_4_);
            auVar74._4_4_ = (int)(fVar86 + auVar97._4_4_);
            auVar74._8_4_ = (int)(fVar87 + auVar97._8_4_);
            auVar74._12_4_ = (int)(fVar88 + auVar97._12_4_);
            auVar81._16_4_ = (int)(fVar89 + auVar97._16_4_);
            auVar81._0_16_ = auVar74;
            auVar81._20_4_ = (int)(fVar90 + auVar97._20_4_);
            auVar81._24_4_ = (int)(fVar91 + auVar97._24_4_);
            auVar81._28_4_ = (int)(auVar76._28_4_ + auVar97._28_4_);
            auVar96._0_4_ = (int)(fVar92 + auVar77._0_4_);
            auVar96._4_4_ = (int)(fVar104 + auVar77._4_4_);
            auVar96._8_4_ = (int)(fVar105 + auVar77._8_4_);
            auVar96._12_4_ = (int)(fVar106 + auVar77._12_4_);
            auVar101._16_4_ = (int)(fVar107 + auVar77._16_4_);
            auVar101._0_16_ = auVar96;
            auVar101._20_4_ = (int)(fVar108 + auVar77._20_4_);
            auVar101._24_4_ = (int)(fVar109 + auVar77._24_4_);
            auVar101._28_4_ = (int)(auVar78._28_4_ + auVar77._28_4_);
            auVar40 = vpackssdw_avx(auVar74,auVar81._16_16_);
            auVar39 = vpackssdw_avx(auVar96,auVar101._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar50);
            auVar39 = vpminsw_avx(auVar39,auVar50);
            auVar40 = vpmaxsw_avx(auVar40,auVar64);
            auVar39 = vpmaxsw_avx(auVar39,auVar64);
            in_ZMM11 = ZEXT1664(auVar39);
            auVar40 = vpacksswb_avx(auVar40,auVar39);
            in_ZMM10 = ZEXT1664(auVar40);
            *(undefined1 (*) [16])(*pauVar28 + lVar21 * 8) = auVar40;
            pauVar26 = pauVar26 + 1;
          }
          for (; (int)lVar21 < max_kk; lVar21 = lVar21 + 1) {
            auVar40 = vinsertps_avx(ZEXT416((uint)pfVar18[lVar13 + lVar21]),
                                    ZEXT416((uint)pfVar18[iVar3 * 5 + lVar21]),0x10);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)pfVar18[iVar3 * 6 + lVar21]),0x20);
            auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)pfVar18[iVar10 + lVar21]),0x30);
            auVar39 = vinsertps_avx(ZEXT416((uint)pfVar18[lVar21]),
                                    ZEXT416((uint)pfVar18[lVar19 + lVar21]),0x10);
            auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)pfVar18[lVar14 + lVar21]),0x20);
            auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)pfVar18[lVar15 + lVar21]),0x30);
            fVar68 = auVar39._0_4_ * fVar30;
            fVar86 = auVar39._4_4_ * fVar31;
            auVar8._4_4_ = fVar86;
            auVar8._0_4_ = fVar68;
            fVar87 = auVar39._8_4_ * fVar32;
            auVar8._8_4_ = fVar87;
            fVar88 = auVar39._12_4_ * fVar33;
            auVar8._12_4_ = fVar88;
            fVar89 = auVar40._0_4_ * fVar30;
            auVar8._16_4_ = fVar89;
            fVar90 = auVar40._4_4_ * fVar31;
            auVar8._20_4_ = fVar90;
            fVar91 = auVar40._8_4_ * fVar32;
            auVar8._24_4_ = fVar91;
            auVar8._28_4_ = auVar40._12_4_;
            auVar97 = vandps_avx(auVar8,auVar38);
            auVar97 = vorps_avx(auVar97,auVar49);
            auVar75._0_4_ = (int)(fVar68 + auVar97._0_4_);
            auVar75._4_4_ = (int)(fVar86 + auVar97._4_4_);
            auVar75._8_4_ = (int)(fVar87 + auVar97._8_4_);
            auVar75._12_4_ = (int)(fVar88 + auVar97._12_4_);
            auVar82._16_4_ = (int)(fVar89 + auVar97._16_4_);
            auVar82._0_16_ = auVar75;
            auVar82._20_4_ = (int)(fVar90 + auVar97._20_4_);
            auVar82._24_4_ = (int)(fVar91 + auVar97._24_4_);
            auVar82._28_4_ = (int)(auVar40._12_4_ + auVar97._28_4_);
            in_ZMM11 = ZEXT1664(auVar82._16_16_);
            auVar40 = vpackssdw_avx(auVar75,auVar82._16_16_);
            auVar40 = vpminsw_avx(auVar40,auVar34);
            auVar40 = vpmaxsw_avx(auVar40,auVar35);
            auVar40 = vpacksswb_avx(auVar40,auVar40);
            in_ZMM10 = ZEXT1664(auVar40);
            *(long *)(*pauVar28 + lVar21 * 8) = auVar40._0_8_;
            pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
          }
        }
        uVar23 = uVar23 + 8;
        lVar27 = lVar27 + lVar17;
        lVar25 = lVar25 + lVar17;
        local_118 = local_118 + lVar17;
        pauVar28 = pauVar26;
      }
      lVar13 = lVar19 * 0x10;
      local_118 = local_118 + (long)pvVar4;
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar37._8_4_ = 0x3f000000;
      auVar37._0_8_ = 0x3f0000003f000000;
      auVar37._12_4_ = 0x3f000000;
      for (; (long)(uVar23 | 3) < lVar22; uVar23 = uVar23 + 4) {
        pfVar18 = (float *)((long)pvVar4 + (lVar29 + uVar23) * lVar19 * 4 + lVar24 * 4);
        if (iVar9 == 4) {
          lVar17 = 0;
          for (iVar10 = 0; iVar10 + 1 < max_kk; iVar10 = iVar10 + 2) {
            pfVar1 = (float *)(local_118 + lVar17 * 4);
            auVar39._0_4_ = fVar30 * *pfVar1;
            auVar39._4_4_ = fVar31 * pfVar1[1];
            auVar39._8_4_ = fVar32 * pfVar1[2];
            auVar39._12_4_ = fVar33 * pfVar1[3];
            pfVar1 = (float *)(local_118 + 0x10 + lVar17 * 4);
            auVar51._0_4_ = fVar30 * *pfVar1;
            auVar51._4_4_ = fVar31 * pfVar1[1];
            auVar51._8_4_ = fVar32 * pfVar1[2];
            auVar51._12_4_ = fVar33 * pfVar1[3];
            auVar40 = vunpcklps_avx(auVar39,auVar51);
            auVar64 = vunpckhps_avx(auVar39,auVar51);
            auVar61 = vandps_avx(auVar40,auVar36);
            auVar50 = vandps_avx(auVar64,auVar36);
            auVar61 = vorps_avx(auVar61,auVar37);
            auVar50 = vorps_avx(auVar50,auVar37);
            auVar52._0_4_ = (int)(auVar40._0_4_ + auVar61._0_4_);
            auVar52._4_4_ = (int)(auVar40._4_4_ + auVar61._4_4_);
            auVar52._8_4_ = (int)(auVar40._8_4_ + auVar61._8_4_);
            auVar52._12_4_ = (int)(auVar40._12_4_ + auVar61._12_4_);
            auVar40._0_4_ = (int)(auVar50._0_4_ + auVar64._0_4_);
            auVar40._4_4_ = (int)(auVar50._4_4_ + auVar64._4_4_);
            auVar40._8_4_ = (int)(auVar50._8_4_ + auVar64._8_4_);
            auVar40._12_4_ = (int)(auVar50._12_4_ + auVar64._12_4_);
            auVar61 = vpackssdw_avx(auVar52,auVar40);
            auVar61 = vpminsw_avx(auVar61,auVar34);
            auVar61 = vpmaxsw_avx(auVar61,auVar35);
            auVar61 = vpacksswb_avx(auVar61,auVar61);
            *(long *)(*pauVar28 + lVar17) = auVar61._0_8_;
            pfVar18 = pfVar18 + 8;
            lVar17 = lVar17 + 8;
          }
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar17);
          for (; iVar10 < max_kk; iVar10 = iVar10 + 1) {
            auVar41._0_4_ = fVar30 * *pfVar18;
            auVar41._4_4_ = fVar31 * pfVar18[1];
            auVar41._8_4_ = fVar32 * pfVar18[2];
            auVar41._12_4_ = fVar33 * pfVar18[3];
            auVar61 = vandps_avx(auVar41,auVar36);
            auVar61 = vorps_avx(auVar61,auVar37);
            auVar42._0_4_ = (int)(auVar41._0_4_ + auVar61._0_4_);
            auVar42._4_4_ = (int)(auVar41._4_4_ + auVar61._4_4_);
            auVar42._8_4_ = (int)(auVar41._8_4_ + auVar61._8_4_);
            auVar42._12_4_ = (int)(auVar41._12_4_ + auVar61._12_4_);
            auVar61 = vpackssdw_avx(auVar42,auVar42);
            auVar61 = vpminsw_avx(auVar61,auVar34);
            auVar61 = vpmaxsw_avx(auVar61,auVar35);
            auVar61 = vpacksswb_avx(auVar61,auVar61);
            *(int *)*pauVar28 = auVar61._0_4_;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 4);
            pfVar18 = pfVar18 + 4;
          }
        }
        if (iVar9 == 1) {
          lVar17 = 0;
          for (iVar10 = 0; iVar10 + 1 < max_kk; iVar10 = iVar10 + 2) {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = *(ulong *)((long)pfVar18 + lVar17);
            auVar61 = vinsertps_avx(auVar43,ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar2)),0x20)
            ;
            auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)((long)pfVar18 +
                                                             lVar17 + (long)(iVar3 + 1) * 4)),0x30);
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *(ulong *)((long)pfVar18 + lVar17 + lVar14 * 4);
            auVar50 = vinsertps_avx(auVar53,ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar15 * 4)),
                                    0x20);
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar16 * 4)),
                                    0x30);
            auVar44._0_4_ = auVar61._0_4_ * fVar30;
            auVar44._4_4_ = auVar61._4_4_ * fVar31;
            auVar44._8_4_ = auVar61._8_4_ * fVar32;
            auVar44._12_4_ = auVar61._12_4_ * fVar33;
            auVar54._0_4_ = auVar50._0_4_ * fVar30;
            auVar54._4_4_ = auVar50._4_4_ * fVar31;
            auVar54._8_4_ = auVar50._8_4_ * fVar32;
            auVar54._12_4_ = auVar50._12_4_ * fVar33;
            auVar61 = vandps_avx(auVar44,auVar36);
            auVar50 = vandps_avx(auVar54,auVar36);
            auVar61 = vorps_avx(auVar61,auVar37);
            auVar50 = vorps_avx(auVar50,auVar37);
            auVar45._0_4_ = (int)(auVar44._0_4_ + auVar61._0_4_);
            auVar45._4_4_ = (int)(auVar44._4_4_ + auVar61._4_4_);
            auVar45._8_4_ = (int)(auVar44._8_4_ + auVar61._8_4_);
            auVar45._12_4_ = (int)(auVar44._12_4_ + auVar61._12_4_);
            auVar55._0_4_ = (int)(auVar50._0_4_ + auVar54._0_4_);
            auVar55._4_4_ = (int)(auVar50._4_4_ + auVar54._4_4_);
            auVar55._8_4_ = (int)(auVar50._8_4_ + auVar54._8_4_);
            auVar55._12_4_ = (int)(auVar50._12_4_ + auVar54._12_4_);
            auVar61 = vpackssdw_avx(auVar45,auVar55);
            auVar61 = vpminsw_avx(auVar61,auVar34);
            auVar61 = vpmaxsw_avx(auVar61,auVar35);
            auVar61 = vpacksswb_avx(auVar61,auVar61);
            *(long *)(*pauVar28 + lVar17) = auVar61._0_8_;
            lVar17 = lVar17 + 8;
          }
          for (; iVar10 < max_kk; iVar10 = iVar10 + 1) {
            auVar61 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar18 + lVar17)),
                                    ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar2)),0x10);
            auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar14 * 4)),
                                    0x20);
            auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)((long)pfVar18 + lVar17 + lVar15 * 4)),
                                    0x30);
            auVar46._0_4_ = auVar61._0_4_ * fVar30;
            auVar46._4_4_ = auVar61._4_4_ * fVar31;
            auVar46._8_4_ = auVar61._8_4_ * fVar32;
            auVar46._12_4_ = auVar61._12_4_ * fVar33;
            auVar61 = vandps_avx(auVar46,auVar36);
            auVar61 = vorps_avx(auVar61,auVar37);
            auVar47._0_4_ = (int)(auVar46._0_4_ + auVar61._0_4_);
            auVar47._4_4_ = (int)(auVar46._4_4_ + auVar61._4_4_);
            auVar47._8_4_ = (int)(auVar46._8_4_ + auVar61._8_4_);
            auVar47._12_4_ = (int)(auVar46._12_4_ + auVar61._12_4_);
            auVar61 = vpackssdw_avx(auVar47,auVar47);
            auVar61 = vpminsw_avx(auVar61,auVar34);
            auVar61 = vpmaxsw_avx(auVar61,auVar35);
            auVar61 = vpacksswb_avx(auVar61,auVar61);
            *(int *)(*pauVar28 + lVar17) = auVar61._0_4_;
            lVar17 = lVar17 + 4;
          }
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar17);
        }
        lVar27 = lVar27 + lVar13;
        lVar25 = lVar25 + lVar13;
        local_118 = local_118 + lVar13;
      }
      auVar48._8_4_ = 0x3effffff;
      auVar48._0_8_ = 0x3effffff3effffff;
      auVar48._12_4_ = 0x3effffff;
      for (; (long)(uVar23 | 1) < lVar22; uVar23 = uVar23 + 2) {
        pvVar4 = B->data;
        pfVar18 = (float *)((long)pvVar4 + lVar20 * 4 + (lVar29 + uVar23) * lVar19 * 4);
        pauVar26 = pauVar28;
        for (lVar13 = 0; (int)lVar13 + 3 < max_kk; lVar13 = lVar13 + 4) {
          auVar56._0_4_ = fVar30 * *pfVar18;
          auVar56._4_4_ = fVar31 * pfVar18[1];
          auVar56._8_4_ = fVar32 * pfVar18[2];
          auVar56._12_4_ = fVar33 * pfVar18[3];
          pfVar1 = (float *)((long)pvVar4 + lVar13 * 4 + lVar25);
          auVar65._0_4_ = fVar30 * *pfVar1;
          auVar65._4_4_ = fVar31 * pfVar1[1];
          auVar65._8_4_ = fVar32 * pfVar1[2];
          auVar65._12_4_ = fVar33 * pfVar1[3];
          auVar64 = vmovlhps_avx(auVar56,auVar65);
          auVar40 = vunpckhpd_avx(auVar56,auVar65);
          auVar61 = vandps_avx(auVar64,auVar36);
          auVar50 = vandps_avx(auVar40,auVar36);
          auVar61 = vorps_avx(auVar61,auVar37);
          auVar50 = vorps_avx(auVar50,auVar37);
          auVar66._0_4_ = (int)(auVar64._0_4_ + auVar61._0_4_);
          auVar66._4_4_ = (int)(auVar64._4_4_ + auVar61._4_4_);
          auVar66._8_4_ = (int)(auVar64._8_4_ + auVar61._8_4_);
          auVar66._12_4_ = (int)(auVar64._12_4_ + auVar61._12_4_);
          auVar57._0_4_ = (int)(auVar50._0_4_ + auVar40._0_4_);
          auVar57._4_4_ = (int)(auVar50._4_4_ + auVar40._4_4_);
          auVar57._8_4_ = (int)(auVar50._8_4_ + auVar40._8_4_);
          auVar57._12_4_ = (int)(auVar50._12_4_ + auVar40._12_4_);
          auVar61 = vpackssdw_avx(auVar66,auVar57);
          auVar61 = vpminsw_avx(auVar61,auVar34);
          auVar61 = vpmaxsw_avx(auVar61,auVar35);
          auVar61 = vpacksswb_avx(auVar61,auVar61);
          *(long *)*pauVar26 = auVar61._0_8_;
          pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
          pfVar18 = pfVar18 + 4;
        }
        for (; (int)lVar13 + 1 < max_kk; lVar13 = lVar13 + 2) {
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)((long)pvVar4 + lVar13 * 4 + lVar25);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)((long)pvVar4 + lVar13 * 4 + lVar27);
          auVar61 = vmovlhps_avx(auVar67,auVar58);
          auVar59._0_4_ = fVar30 * auVar61._0_4_;
          auVar59._4_4_ = fVar31 * auVar61._4_4_;
          auVar59._8_4_ = fVar32 * auVar61._8_4_;
          auVar59._12_4_ = fVar33 * auVar61._12_4_;
          auVar61 = vandps_avx(auVar59,auVar36);
          auVar61 = vorps_avx(auVar61,auVar37);
          auVar60._0_4_ = (int)(auVar59._0_4_ + auVar61._0_4_);
          auVar60._4_4_ = (int)(auVar59._4_4_ + auVar61._4_4_);
          auVar60._8_4_ = (int)(auVar59._8_4_ + auVar61._8_4_);
          auVar60._12_4_ = (int)(auVar59._12_4_ + auVar61._12_4_);
          auVar61 = vpackssdw_avx(auVar60,auVar60);
          auVar61 = vpminsw_avx(auVar61,auVar34);
          auVar61 = vpmaxsw_avx(auVar61,auVar35);
          auVar61 = vpacksswb_avx(auVar61,auVar61);
          *(int *)(*pauVar28 + lVar13 * 2) = auVar61._0_4_;
          pauVar26 = (undefined1 (*) [16])(*pauVar26 + 4);
        }
        for (; pauVar28 = pauVar26, (int)lVar13 < max_kk; lVar13 = lVar13 + 1) {
          fVar68 = scale * *(float *)((long)pvVar4 + lVar13 * 4 + lVar27);
          auVar61 = vandps_avx(ZEXT416((uint)fVar68),auVar36);
          auVar61 = vorps_avx(auVar61,auVar48);
          auVar61 = ZEXT416((uint)(fVar68 + auVar61._0_4_));
          auVar61 = vroundss_avx(auVar61,auVar61,0xb);
          iVar9 = (int)auVar61._0_4_;
          if ((int)auVar61._0_4_ < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          (*pauVar28)[0] = (char)iVar9;
          fVar68 = scale * *(float *)((long)pvVar4 + lVar13 * 4 + lVar25);
          auVar61 = vandps_avx(ZEXT416((uint)fVar68),auVar36);
          auVar61 = vorps_avx(auVar61,auVar48);
          auVar61 = ZEXT416((uint)(fVar68 + auVar61._0_4_));
          auVar61 = vroundss_avx(auVar61,auVar61,0xb);
          iVar9 = (int)auVar61._0_4_;
          if ((int)auVar61._0_4_ < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          (*pauVar28)[1] = (char)iVar9;
          pauVar26 = (undefined1 (*) [16])(*pauVar28 + 2);
        }
        lVar27 = lVar27 + lVar19 * 8;
        lVar25 = lVar25 + lVar19 * 8;
      }
      for (; (long)uVar23 < lVar22; uVar23 = uVar23 + 1) {
        pvVar4 = B->data;
        pfVar18 = (float *)((long)pvVar4 + lVar20 * 4 + (lVar29 + uVar23) * lVar19 * 4);
        for (lVar25 = 0; (int)lVar25 + 3 < max_kk; lVar25 = lVar25 + 4) {
          auVar62._0_4_ = fVar30 * *pfVar18;
          auVar62._4_4_ = fVar31 * pfVar18[1];
          auVar62._8_4_ = fVar32 * pfVar18[2];
          auVar62._12_4_ = fVar33 * pfVar18[3];
          auVar61 = vandps_avx(auVar62,auVar36);
          auVar61 = vorps_avx(auVar61,auVar37);
          auVar63._0_4_ = (int)(auVar62._0_4_ + auVar61._0_4_);
          auVar63._4_4_ = (int)(auVar62._4_4_ + auVar61._4_4_);
          auVar63._8_4_ = (int)(auVar62._8_4_ + auVar61._8_4_);
          auVar63._12_4_ = (int)(auVar62._12_4_ + auVar61._12_4_);
          auVar61 = vpackssdw_avx(auVar63,auVar63);
          auVar61 = vpminsw_avx(auVar61,auVar34);
          auVar61 = vpmaxsw_avx(auVar61,auVar35);
          auVar61 = vpacksswb_avx(auVar61,auVar61);
          *(int *)(*pauVar28 + lVar25) = auVar61._0_4_;
          pfVar18 = pfVar18 + 4;
        }
        for (; (int)lVar25 < max_kk; lVar25 = lVar25 + 1) {
          fVar68 = scale * *(float *)((long)pvVar4 + lVar25 * 4 + lVar27);
          auVar61 = vandps_avx(ZEXT416((uint)fVar68),auVar36);
          auVar61 = vorps_avx(auVar61,auVar48);
          auVar61 = ZEXT416((uint)(fVar68 + auVar61._0_4_));
          auVar61 = vroundss_avx(auVar61,auVar61,0xb);
          iVar9 = (int)auVar61._0_4_;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          (*pauVar28)[lVar25] = (char)iVar9;
        }
        lVar27 = lVar27 + lVar2;
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar25);
      }
      return;
    }
    pack_B_tile_fp32_to_int8_avx2(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

static void pack_B_tile_quantize(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}